

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_setup_connection(connectdata *conn)

{
  char **ppcVar1;
  SessionHandle *data_00;
  CURLcode CVar2;
  void *pvVar3;
  SessionHandle *data;
  
  data_00 = conn->data;
  if (((conn->bits).httpproxy == true) && ((data_00->set).tunnel_thru_httpproxy == false)) {
    if (conn->handler == &Curl_handler_smtp) {
      conn->handler = &Curl_handler_smtp_proxy;
      CVar2 = Curl_http_setup_conn(conn);
      return CVar2;
    }
    Curl_failf(data_00,"SMTPS not supported!");
    CVar2 = CURLE_UNSUPPORTED_PROTOCOL;
  }
  else {
    pvVar3 = (*Curl_ccalloc)(0x28,1);
    (data_00->req).protop = pvVar3;
    if (pvVar3 == (void *)0x0) {
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    else {
      ppcVar1 = &(data_00->state).path;
      *ppcVar1 = *ppcVar1 + 1;
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode smtp_setup_connection(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  CURLcode result;

  if(conn->bits.httpproxy && !data->set.tunnel_thru_httpproxy) {
    /* Unless we have asked to tunnel SMTP operations through the proxy, we
       switch and use HTTP operations only */
#ifndef CURL_DISABLE_HTTP
    if(conn->handler == &Curl_handler_smtp)
      conn->handler = &Curl_handler_smtp_proxy;
    else {
#ifdef USE_SSL
      conn->handler = &Curl_handler_smtps_proxy;
#else
      failf(data, "SMTPS not supported!");
      return CURLE_UNSUPPORTED_PROTOCOL;
#endif
    }
    /* set it up as a HTTP connection instead */
    return conn->handler->setup_connection(conn);

#else
    failf(data, "SMTP over http proxy requires HTTP support built-in!");
    return CURLE_UNSUPPORTED_PROTOCOL;
#endif
  }

  /* Initialise the SMTP layer */
  result = smtp_init(conn);
  if(result)
    return result;

  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}